

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_light_calib.cpp
# Opt level: O0

void crossPoint(structure_light *a,
               vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
               *crossPoint)

{
  float fVar1;
  float fVar2;
  float fVar3;
  bool bVar4;
  reference pvVar5;
  reference __x;
  float *pfVar6;
  double dVar7;
  double dVar8;
  Point_<float> local_150;
  Point2f temp;
  double b2;
  double k2;
  double b1;
  double k1;
  _InputArray local_110;
  int local_f8;
  int local_f4;
  int n;
  int m;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> lightcornerPoint;
  Vec4f cornerLine;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> cornerlinePoint;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> cornerPoint;
  _InputArray local_70;
  undefined1 local_58 [8];
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> lightLinePoint;
  Vec4f lightLine;
  int local_1c;
  int i;
  vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
  *crossPoint_local;
  structure_light *a_local;
  
  for (local_1c = 0; local_1c < imageCount; local_1c = local_1c + 1) {
    join_0x00000010_0x00000000_ =
         std::vector<bool,_std::allocator<bool>_>::operator[](&a->isRecognize,(long)local_1c);
    bVar4 = std::_Bit_reference::operator_cast_to_bool
                      ((_Bit_reference *)(lightLine.super_Matx<float,_4,_1>.val + 2));
    if (bVar4) {
      cv::Vec<float,_4>::Vec
                ((Vec<float,_4> *)
                 &lightLinePoint.
                  super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage);
      pvVar5 = std::
               vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
               ::operator[](&a->lightPlaneSubpixelImagePoint,(long)local_1c);
      std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::vector
                ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)local_58,pvVar5);
      cv::_InputArray::_InputArray<cv::Point_<float>>
                (&local_70,
                 (vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)local_58);
      cv::_OutputArray::_OutputArray<float,4,1>
                ((_OutputArray *)
                 &cornerPoint.
                  super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage,
                 (Matx<float,_4,_1> *)
                 &lightLinePoint.
                  super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage);
      cv::fitLine(&local_70,
                  (_OutputArray *)
                  &cornerPoint.
                   super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage,2,0.0,0.01,0.01);
      cv::_OutputArray::~_OutputArray
                ((_OutputArray *)
                 &cornerPoint.
                  super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage);
      cv::_InputArray::~_InputArray(&local_70);
      pvVar5 = std::
               vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
               ::operator[](&a->calibImagePoint,(long)local_1c);
      std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::vector
                ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)
                 &cornerlinePoint.
                  super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage,pvVar5);
      std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::vector
                ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)
                 (cornerLine.super_Matx<float,_4,_1>.val + 2));
      cv::Vec<float,_4>::Vec
                ((Vec<float,_4> *)
                 &lightcornerPoint.
                  super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage);
      std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::vector
                ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)&n);
      for (local_f4 = 0; local_f4 < patternSize.width; local_f4 = local_f4 + 1) {
        for (local_f8 = 0; local_f8 < patternSize.height; local_f8 = local_f8 + 1) {
          __x = std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::operator[]
                          ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)
                           &cornerlinePoint.
                            super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,
                           (long)(local_f8 * patternSize.width + local_f4));
          std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::push_back
                    ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)
                     (cornerLine.super_Matx<float,_4,_1>.val + 2),__x);
        }
        cv::_InputArray::_InputArray<cv::Point_<float>>
                  (&local_110,
                   (vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)
                   (cornerLine.super_Matx<float,_4,_1>.val + 2));
        cv::_OutputArray::_OutputArray<float,4,1>
                  ((_OutputArray *)&k1,
                   (Matx<float,_4,_1> *)
                   &lightcornerPoint.
                    super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
        cv::fitLine(&local_110,(_OutputArray *)&k1,2,0.0,0.01,0.01);
        cv::_OutputArray::~_OutputArray((_OutputArray *)&k1);
        cv::_InputArray::~_InputArray(&local_110);
        pfVar6 = cv::Vec<float,_4>::operator[]
                           ((Vec<float,_4> *)
                            &lightcornerPoint.
                             super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,1);
        fVar1 = *pfVar6;
        pfVar6 = cv::Vec<float,_4>::operator[]
                           ((Vec<float,_4> *)
                            &lightcornerPoint.
                             super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
        dVar7 = (double)(fVar1 / *pfVar6);
        pfVar6 = cv::Vec<float,_4>::operator[]
                           ((Vec<float,_4> *)
                            &lightcornerPoint.
                             super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,3);
        fVar1 = *pfVar6;
        pfVar6 = cv::Vec<float,_4>::operator[]
                           ((Vec<float,_4> *)
                            &lightcornerPoint.
                             super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,2);
        dVar8 = (double)fVar1 - dVar7 * (double)*pfVar6;
        pfVar6 = cv::Vec<float,_4>::operator[]
                           ((Vec<float,_4> *)
                            &lightLinePoint.
                             super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,1);
        fVar1 = *pfVar6;
        pfVar6 = cv::Vec<float,_4>::operator[]
                           ((Vec<float,_4> *)
                            &lightLinePoint.
                             super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
        fVar2 = *pfVar6;
        pfVar6 = cv::Vec<float,_4>::operator[]
                           ((Vec<float,_4> *)
                            &lightLinePoint.
                             super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,3);
        fVar3 = *pfVar6;
        pfVar6 = cv::Vec<float,_4>::operator[]
                           ((Vec<float,_4> *)
                            &lightLinePoint.
                             super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,2);
        temp = (Point2f)((double)fVar3 - (double)(fVar1 / fVar2) * (double)*pfVar6);
        cv::Point_<float>::Point_(&local_150);
        local_150.x = (float)(((double)temp - dVar8) / (dVar7 - (double)(fVar1 / fVar2)));
        local_150.y = (float)(dVar7 * (double)local_150.x + dVar8);
        std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::push_back
                  ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)&n,&local_150);
        std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::clear
                  ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)
                   (cornerLine.super_Matx<float,_4,_1>.val + 2));
      }
      std::
      vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
      ::push_back(crossPoint,(value_type *)&n);
      std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::~vector
                ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)&n);
      std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::~vector
                ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)
                 (cornerLine.super_Matx<float,_4,_1>.val + 2));
      std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::~vector
                ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)
                 &cornerlinePoint.
                  super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage);
      std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::~vector
                ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)local_58);
    }
  }
  return;
}

Assistant:

void crossPoint(structure_light &a, vector<vector<Point2f>> &crossPoint)
{
    for (int i = 0; i < imageCount; i++)
    {
        if (a.isRecognize[i] == false)
            continue;
        Vec4f lightLine;
        vector<Point2f> lightLinePoint = a.lightPlaneSubpixelImagePoint[i];//取出第i张标定图像 的亚像素光条中心点
        fitLine(lightLinePoint, lightLine, DIST_L2, 0, 1e-2, 1e-2);//将第i张图的 光条中心点进行直线拟合
        vector<Point2f> cornerPoint = a.calibImagePoint[i];//靶标平面上圆形标记中心的点（49个）的二维坐标
        vector<Point2f> cornerlinePoint;//存储某一列的圆形标记的中心
        Vec4f cornerLine;//一列圆标记中心拟合出的直线的参数
        vector<Point2f> lightcornerPoint;//提取出的光条上的点
        //提取光条上的点，思路：取一列（或者一行）圆形标记的中心，拟合成直线，计算拟合出直线和光条的交点
        for (int m = 0; m < patternSize.width; m++)//遍历所有列7次
        {
            for (int n = 0; n < patternSize.height; n++)
            {
                cornerlinePoint.push_back(cornerPoint[n*patternSize.width + m]);//取第m列圆形标记的中心
            }
            fitLine(cornerlinePoint, cornerLine, DIST_L2, 0, 1e-2, 1e-2);//将第m列的圆心拟合成直线
            //求出第m列圆心拟合出来的直线和光条直线的交点
            double k1 = cornerLine[1] / cornerLine[0];
            double b1 = cornerLine[3] - k1*cornerLine[2];
            double k2 = lightLine[1] / lightLine[0];
            double b2 = lightLine[3] - k2*lightLine[2];
            Point2f temp;
            temp.x = (b2 - b1) / (k1 - k2);
            temp.y = k1*temp.x + b1;
            //将交点压入向量
            lightcornerPoint.push_back(temp);
            cornerlinePoint.clear();
        }
        crossPoint.push_back(lightcornerPoint);
    }
}